

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dyn_tbl.cpp
# Opt level: O1

dyn_tbl_t * dyn_tbl_init(uint length,int lgn,longlong T)

{
  dyn_tbl_t *pdVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  
  pdVar1 = (dyn_tbl_t *)operator_new(0x60);
  auVar3 = ZEXT1632(ZEXT816(0) << 0x40);
  (pdVar1->array)._M_h._M_buckets = (__buckets_ptr)auVar3._0_8_;
  (pdVar1->array)._M_h._M_bucket_count = auVar3._8_8_;
  (pdVar1->array)._M_h._M_before_begin = (__node_base)auVar3._16_8_;
  (pdVar1->array)._M_h._M_element_count = auVar3._24_8_;
  *(undefined1 (*) [32])&(pdVar1->array)._M_h._M_rehash_policy = auVar3;
  auVar3 = ZEXT1632(ZEXT816(0) << 0x40);
  pdVar1->max_len = auVar3._0_4_;
  pdVar1->decrement = auVar3._4_4_;
  pdVar1->T = auVar3._8_8_;
  pdVar1->max_value = auVar3._16_8_;
  pdVar1->lgn = auVar3._24_4_;
  *(int *)&pdVar1->field_0x5c = auVar3._28_4_;
  (pdVar1->array)._M_h._M_buckets = &(pdVar1->array)._M_h._M_single_bucket;
  (pdVar1->array)._M_h._M_bucket_count = 1;
  auVar2 = ZEXT416(0) << 0x40;
  (pdVar1->array)._M_h._M_before_begin = (__node_base)auVar2._0_8_;
  (pdVar1->array)._M_h._M_element_count = auVar2._8_8_;
  (pdVar1->array)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  *(undefined1 (*) [16])&(pdVar1->array)._M_h._M_rehash_policy._M_next_resize = auVar2;
  pdVar1->lgn = lgn;
  pdVar1->max_len = length;
  pdVar1->decrement = 0;
  pdVar1->total = 0;
  pdVar1->T = T;
  pdVar1->max_value = 0;
  return pdVar1;
}

Assistant:

dyn_tbl_t* dyn_tbl_init(unsigned int length, int lgn, long long T) {
	dyn_tbl_t* ret = new dyn_tbl_t();
	ret->lgn = lgn;
	ret->max_len = length;
	ret->decrement = 0;
	ret->total = 0;
	ret->T = T;
	ret->max_value = 0;
	return ret;
}